

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_SetStagePredictFn(ARKodeMem ark_mem,ARKStagePredictFn PredictStage)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_10;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetStagePredictFn",&local_10);
  if (iVar1 == 0) {
    local_10->stage_predict = PredictStage;
  }
  return iVar1;
}

Assistant:

int mriStep_SetStagePredictFn(ARKodeMem ark_mem, ARKStagePredictFn PredictStage)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure and set function pointer */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  step_mem->stage_predict = PredictStage;
  return (ARK_SUCCESS);
}